

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall
leveldb::_Test_L0_CompactionBug_Issue44_b::_Run(_Test_L0_CompactionBug_Issue44_b *this)

{
  allocator local_21a;
  allocator local_219;
  string local_218;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  Tester local_1a8;
  
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::__cxx11::string::string((string *)&local_1a8,"",&local_219);
  std::__cxx11::string::string((string *)&local_218,"",&local_21a);
  DBTest::Put((DBTest *)(local_1b8 + 8),(string *)this,(string *)&local_1a8);
  Status::~Status((Status *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::__cxx11::string::string((string *)&local_1a8,"e",(allocator *)&local_218);
  DBTest::Delete((DBTest *)local_1b8,(string *)this);
  Status::~Status((Status *)local_1b8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1a8,"",&local_219);
  std::__cxx11::string::string((string *)&local_218,"",&local_21a);
  DBTest::Put((DBTest *)(local_1c8 + 8),(string *)this,(string *)&local_1a8);
  Status::~Status((Status *)(local_1c8 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::__cxx11::string::string((string *)&local_1a8,"c",&local_219);
  std::__cxx11::string::string((string *)&local_218,"cv",&local_21a);
  DBTest::Put((DBTest *)local_1c8,(string *)this,(string *)&local_1a8);
  Status::~Status((Status *)local_1c8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::__cxx11::string::string((string *)&local_1a8,"",&local_219);
  std::__cxx11::string::string((string *)&local_218,"",&local_21a);
  DBTest::Put((DBTest *)(local_1d8 + 8),(string *)this,(string *)&local_1a8);
  Status::~Status((Status *)(local_1d8 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::__cxx11::string::string((string *)&local_1a8,"",&local_219);
  std::__cxx11::string::string((string *)&local_218,"",&local_21a);
  DBTest::Put((DBTest *)local_1d8,(string *)this,(string *)&local_1a8);
  Status::~Status((Status *)local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  anon_unknown_4::DelayMilliseconds(1000);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::__cxx11::string::string((string *)&local_1a8,"d",&local_219);
  std::__cxx11::string::string((string *)&local_218,"dv",&local_21a);
  DBTest::Put((DBTest *)(local_1e8 + 8),(string *)this,(string *)&local_1a8);
  Status::~Status((Status *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::__cxx11::string::string((string *)&local_1a8,"",&local_219);
  std::__cxx11::string::string((string *)&local_218,"",&local_21a);
  DBTest::Put((DBTest *)local_1e8,(string *)this,(string *)&local_1a8);
  Status::~Status((Status *)local_1e8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::__cxx11::string::string((string *)&local_1a8,"d",(allocator *)&local_218);
  DBTest::Delete((DBTest *)(local_1f8 + 8),(string *)this);
  Status::~Status((Status *)(local_1f8 + 8));
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1a8,"b",(allocator *)&local_218);
  DBTest::Delete((DBTest *)local_1f8,(string *)this);
  Status::~Status((Status *)local_1f8);
  std::__cxx11::string::~string((string *)&local_1a8);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5d2);
  DBTest::Contents_abi_cxx11_(&local_218,&this->super_DBTest);
  test::Tester::IsEq<char[12],std::__cxx11::string>
            (&local_1a8,(char (*) [12])"(->)(c->cv)",&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  test::Tester::~Tester(&local_1a8);
  anon_unknown_4::DelayMilliseconds(1000);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5d4);
  DBTest::Contents_abi_cxx11_(&local_218,&this->super_DBTest);
  test::Tester::IsEq<char[12],std::__cxx11::string>
            (&local_1a8,(char (*) [12])"(->)(c->cv)",&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  test::Tester::~Tester(&local_1a8);
  return;
}

Assistant:

TEST(DBTest, L0_CompactionBug_Issue44_b) {
  Reopen();
  Put("", "");
  Reopen();
  Delete("e");
  Put("", "");
  Reopen();
  Put("c", "cv");
  Reopen();
  Put("", "");
  Reopen();
  Put("", "");
  DelayMilliseconds(1000);  // Wait for compaction to finish
  Reopen();
  Put("d", "dv");
  Reopen();
  Put("", "");
  Reopen();
  Delete("d");
  Delete("b");
  Reopen();
  ASSERT_EQ("(->)(c->cv)", Contents());
  DelayMilliseconds(1000);  // Wait for compaction to finish
  ASSERT_EQ("(->)(c->cv)", Contents());
}